

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall Potassco::ProgramOptions::ContextError::~ContextError(ContextError *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ContextError_0015c978;
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  Error::~Error((Error *)0x1303f2);
  return;
}

Assistant:

~ContextError() throw () {}